

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O2

void ImPlot::PlotDigitalEx<ImPlot::GetterXsYs<signed_char>>
               (char *label_id,GetterXsYs<signed_char> getter)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ImPlotContext *pIVar5;
  ImPlotContext *pIVar6;
  bool bVar7;
  ImU32 col;
  ImDrawList *this;
  int iVar8;
  int iVar9;
  ImVec2 IVar10;
  float fVar11;
  double dVar12;
  ImVec2 pMax;
  ImVec2 pMin;
  ImPlotPoint local_78;
  ImRect *local_68;
  int local_5c;
  ImPlotPoint itemData1;
  
  bVar7 = BeginItem(label_id,1);
  pIVar5 = GImPlot;
  if (bVar7) {
    this = GetPlotDrawList();
    pIVar6 = GImPlot;
    if ((1 < getter.Count) && ((GImPlot->NextItemData).RenderFill == true)) {
      iVar8 = GImPlot->CurrentPlot->CurrentYAxis;
      itemData1 = GetterXsYs<signed_char>::operator()(&getter,0);
      local_68 = pIVar5->PixelRange + iVar8;
      iVar9 = 0;
      for (iVar8 = 0; iVar8 < getter.Count; iVar8 = iVar8 + 1) {
        local_78 = GetterXsYs<signed_char>::operator()(&getter,iVar8);
        dVar12 = local_78.y;
        if ((ulong)ABS(itemData1.y) < 0x7ff0000000000000) {
          if (0x7fefffffffffffff < (ulong)ABS(dVar12)) {
            dVar12 = (double)(-(ulong)(INFINITY <= dVar12) & 0x7fefffffffffffff |
                             ~-(ulong)(INFINITY <= dVar12) &
                             (~-(ulong)(dVar12 <= -INFINITY) & (ulong)dVar12 |
                             -(ulong)(dVar12 <= -INFINITY) & 0xffefffffffffffff));
            local_78.y = (double)(-(ulong)(!NAN(dVar12) && !NAN(dVar12)) & (ulong)dVar12);
          }
          fVar1 = (pIVar6->NextItemData).LineWeight;
          dVar12 = (double)(~-(ulong)(itemData1.y <= 0.0) & (ulong)itemData1.y);
          itemData1.y = dVar12;
          fVar2 = (pIVar6->NextItemData).DigitalBitHeight;
          fVar11 = (float)dVar12 * fVar2;
          local_5c = (int)((float)(-(uint)(fVar11 <= fVar2) & (uint)fVar2 |
                                  ~-(uint)(fVar11 <= fVar2) & (uint)fVar11) +
                          (pIVar6->NextItemData).DigitalBitGap);
          if (local_5c < iVar9) {
            local_5c = iVar9;
          }
          pMin = PlotToPixels(&itemData1,-1);
          IVar10 = PlotToPixels(&local_78,-1);
          fVar2 = (local_68->Min).y;
          pMin.y = (float)(-0x14 - pIVar5->DigitalPlotOffset) + fVar2;
          pMax.x = IVar10.x;
          pMax.y = (float)(-0x14 - ((int)fVar1 + pIVar5->DigitalPlotOffset + (int)fVar11)) + fVar2;
          while (iVar8 + 2 < getter.Count) {
            if ((itemData1.y != local_78.y) || (NAN(itemData1.y) || NAN(local_78.y))) break;
            local_78 = GetterXsYs<signed_char>::operator()(&getter,iVar8 + 1);
            if (0x7fefffffffffffff < (ulong)ABS(local_78.y)) break;
            IVar10 = PlotToPixels(&local_78,-1);
            pMax.x = IVar10.x;
            iVar8 = iVar8 + 1;
          }
          fVar1 = (local_68->Min).x;
          fVar2 = pMin.x;
          if (pMin.x < fVar1) {
            pMin.x = fVar1;
            fVar2 = fVar1;
          }
          fVar11 = pMax.x;
          if (pMax.x < fVar1) {
            pMax.x = fVar1;
            fVar11 = fVar1;
          }
          fVar1 = (local_68->Max).x;
          if (fVar1 < fVar2) {
            pMin.x = fVar1;
            fVar2 = fVar1;
          }
          if (fVar1 < fVar11) {
            pMax.x = fVar1;
            fVar11 = fVar1;
          }
          iVar9 = local_5c;
          if ((fVar2 < fVar11) &&
             ((bVar7 = ImRect::Contains(&pIVar5->CurrentPlot->PlotRect,&pMin), bVar7 ||
              (bVar7 = ImRect::Contains(&pIVar5->CurrentPlot->PlotRect,&pMax), iVar9 = local_5c,
              bVar7)))) {
            col = ImGui::GetColorU32((pIVar6->NextItemData).Colors + 1);
            ImDrawList::AddRectFilled(this,&pMin,&pMax,col,0.0,0xf);
            iVar9 = local_5c;
          }
        }
        itemData1 = local_78;
      }
      uVar3 = pIVar5->DigitalPlotItemCnt;
      uVar4 = pIVar5->DigitalPlotOffset;
      pIVar5->DigitalPlotItemCnt = uVar3 + 1;
      pIVar5->DigitalPlotOffset = iVar9 + uVar4;
    }
    EndItem();
  }
  return;
}

Assistant:

inline void PlotDigitalEx(const char* label_id, Getter getter) {
    if (BeginItem(label_id, ImPlotCol_Fill)) {
        ImPlotContext& gp = *GImPlot;
        ImDrawList& DrawList = *GetPlotDrawList();
        const ImPlotNextItemData& s = GetItemData();
        if (getter.Count > 1 && s.RenderFill) {
            const int y_axis = GetCurrentYAxis();
            int pixYMax = 0;
            ImPlotPoint itemData1 = getter(0);
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPoint itemData2 = getter(i);
                if (ImNanOrInf(itemData1.y)) {
                    itemData1 = itemData2;
                    continue;
                }
                if (ImNanOrInf(itemData2.y)) itemData2.y = ImConstrainNan(ImConstrainInf(itemData2.y));
                int pixY_0 = (int)(s.LineWeight);
                itemData1.y = ImMax(0.0, itemData1.y);
                float pixY_1_float = s.DigitalBitHeight * (float)itemData1.y;
                int pixY_1 = (int)(pixY_1_float); //allow only positive values
                int pixY_chPosOffset = (int)(ImMax(s.DigitalBitHeight, pixY_1_float) + s.DigitalBitGap);
                pixYMax = ImMax(pixYMax, pixY_chPosOffset);
                ImVec2 pMin = PlotToPixels(itemData1);
                ImVec2 pMax = PlotToPixels(itemData2);
                int pixY_Offset = 20; //20 pixel from bottom due to mouse cursor label
                pMin.y = (gp.PixelRange[y_axis].Min.y) + ((-gp.DigitalPlotOffset)                   - pixY_Offset);
                pMax.y = (gp.PixelRange[y_axis].Min.y) + ((-gp.DigitalPlotOffset) - pixY_0 - pixY_1 - pixY_Offset);
                //plot only one rectangle for same digital state
                while (((i+2) < getter.Count) && (itemData1.y == itemData2.y)) {
                    const int in = (i + 1);
                    itemData2 = getter(in);
                    if (ImNanOrInf(itemData2.y)) break;
                    pMax.x = PlotToPixels(itemData2).x;
                    i++;
                }
                //do not extend plot outside plot range
                if (pMin.x < gp.PixelRange[y_axis].Min.x) pMin.x = gp.PixelRange[y_axis].Min.x;
                if (pMax.x < gp.PixelRange[y_axis].Min.x) pMax.x = gp.PixelRange[y_axis].Min.x;
                if (pMin.x > gp.PixelRange[y_axis].Max.x) pMin.x = gp.PixelRange[y_axis].Max.x;
                if (pMax.x > gp.PixelRange[y_axis].Max.x) pMax.x = gp.PixelRange[y_axis].Max.x;
                //plot a rectangle that extends up to x2 with y1 height
                if ((pMax.x > pMin.x) && (gp.CurrentPlot->PlotRect.Contains(pMin) || gp.CurrentPlot->PlotRect.Contains(pMax))) {
                    // ImVec4 colAlpha = item->Color;
                    // colAlpha.w = item->Highlight ? 1.0f : 0.9f;
                    DrawList.AddRectFilled(pMin, pMax, ImGui::GetColorU32(s.Colors[ImPlotCol_Fill]));
                }
                itemData1 = itemData2;
            }
            gp.DigitalPlotItemCnt++;
            gp.DigitalPlotOffset += pixYMax;
        }
        EndItem();
    }
}